

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void BIT_flushBitsFast(BIT_CStream_t *bitC)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  
  uVar1 = bitC->bitPos;
  if (0x3f < uVar1) {
    __assert_fail("bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5f6,"void BIT_flushBitsFast(BIT_CStream_t *)");
  }
  puVar2 = (ulong *)bitC->ptr;
  if (puVar2 <= bitC->endPtr) {
    uVar3 = bitC->bitContainer;
    *puVar2 = uVar3;
    bitC->ptr = (char *)((ulong)(uVar1 >> 3) + (long)puVar2);
    bitC->bitPos = uVar1 & 7;
    bitC->bitContainer = uVar3 >> ((byte)uVar1 & 0x38);
    return;
  }
  __assert_fail("bitC->ptr <= bitC->endPtr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5f7,"void BIT_flushBitsFast(BIT_CStream_t *)");
}

Assistant:

MEM_STATIC void BIT_flushBitsFast(BIT_CStream_t* bitC)
{
    size_t const nbBytes = bitC->bitPos >> 3;
    assert(bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    assert(bitC->ptr <= bitC->endPtr);
    MEM_writeLEST(bitC->ptr, bitC->bitContainer);
    bitC->ptr += nbBytes;
    bitC->bitPos &= 7;
    bitC->bitContainer >>= nbBytes*8;
}